

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

Value __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::
makeObject<jsonnet::internal::(anonymous_namespace)::HeapSimpleObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>>>,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>>
          (Interpreter *this,
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          *args,map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                *args_1,
          list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *args_2)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  anon_union_8_3_4e909c26_for_v extraout_RDX;
  anon_union_8_3_4e909c26_for_v extraout_RDX_00;
  anon_union_8_3_4e909c26_for_v aVar3;
  Value VVar4;
  Value v;
  _List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> _Stack_78;
  HeapEntity *local_60;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  local_58;
  
  VVar4._0_8_ = (HeapEntity *)operator_new(0x88);
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  ::map(&local_58,args_1);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::list
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)&_Stack_78
             ,args_2);
  (VVar4._0_8_)->type = SIMPLE_OBJECT;
  (VVar4._0_8_)->_vptr_HeapEntity = (_func_int **)&PTR__HeapSimpleObject_002416c0;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         *)(VVar4._0_8_ + 1),args);
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
         *)(VVar4._0_8_ + 4),&local_58);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::list
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
             (VVar4._0_8_ + 7),
             (list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)&_Stack_78
            );
  std::__cxx11::_List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
  _M_clear(&_Stack_78);
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  ::~map(&local_58);
  local_60 = VVar4._0_8_;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)(this + 0x18),&local_60);
  (VVar4._0_8_)->mark = (GarbageCollectionMark)this[0x10];
  *(long *)(this + 0x38) = *(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3;
  bVar1 = anon_unknown_0::Heap::checkHeap((Heap *)this);
  aVar3 = extraout_RDX;
  if (bVar1) {
    anon_unknown_0::Heap::markFrom((Heap *)this,VVar4._0_8_);
    anon_unknown_0::Stack::mark((Stack *)(this + 0x50),(Heap *)this);
    v._4_4_ = 0;
    v.t = *(uint *)(this + 0x40);
    v.v.h = ((anon_union_8_3_4e909c26_for_v *)(this + 0x48))->h;
    anon_unknown_0::Heap::markFrom((Heap *)this,v);
    for (p_Var2 = *(_Rb_tree_node_base **)(this + 0xe0);
        p_Var2 != (_Rb_tree_node_base *)(this + 0xd0);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (*(HeapEntity **)(*(long *)(p_Var2 + 3) + 0x40) != (HeapEntity *)0x0) {
        anon_unknown_0::Heap::markFrom((Heap *)this,*(HeapEntity **)(*(long *)(p_Var2 + 3) + 0x40));
      }
    }
    for (p_Var2 = *(_Rb_tree_node_base **)(this + 0x1b0);
        p_Var2 != (_Rb_tree_node_base *)(this + 0x1a0);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      anon_unknown_0::Heap::markFrom((Heap *)this,*(HeapEntity **)(p_Var2 + 2));
    }
    anon_unknown_0::Heap::sweep((Heap *)this);
    aVar3 = extraout_RDX_00;
  }
  VVar4.v.h = aVar3.h;
  return VVar4;
}

Assistant:

Value makeObject(Args... args)
    {
        Value r;
        r.t = Value::OBJECT;
        r.v.h = makeHeap<T>(args...);
        return r;
    }